

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::value::TryGetUnderlyingTypeName_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,value *this,uint32_t tyid)

{
  bool bVar1;
  value_type *pvVar2;
  char *pcVar3;
  uint32_t tyid_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  allocator local_1b1;
  undefined1 local_1b0 [8];
  string s;
  iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_> local_188;
  const_iterator ret;
  uint32_t scalar_tid;
  bool array_bit;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> utynamemap;
  uint32_t tyid_local;
  
  utynamemap.data_[0x15].pair.second.data_._4_4_ = (uint)this;
  memcpy(&scalar_tid,&DAT_00ca3b60,0x160);
  ret.pos._7_1_ = (utynamemap.data_[0x15].pair.second.data_._4_4_ & 0x100000) != 0;
  ret.pos._0_4_ = utynamemap.data_[0x15].pair.second.data_._4_4_ & 0xffefffff;
  local_188.pos =
       (element<unsigned_int,_mapbox::eternal::string> *)
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL>::find
                 ((map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL>
                   *)&scalar_tid,(key_type *)&ret);
  s.field_2._8_8_ =
       mapbox::eternal::impl::
       map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL>::end
                 ((map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL>
                   *)&scalar_tid);
  bVar1 = mapbox::eternal::
          iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>::
          operator!=(&local_188,
                     (iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>
                      *)((long)&s.field_2 + 8));
  if (bVar1) {
    pvVar2 = mapbox::eternal::
             iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>::
             operator->(&local_188);
    pcVar3 = mapbox::eternal::string::c_str(&pvVar2->second);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_1b0,pcVar3,&local_1b1);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    if ((ret.pos._7_1_ & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)local_1b0,"[]");
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    ::std::__cxx11::string::~string((string *)local_1b0);
  }
  else {
    TryGetTypeName_abi_cxx11_
              (&local_1e0,(value *)(ulong)utynamemap.data_[0x15].pair.second.data_._4_4_,tyid_00);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_1e0);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> TryGetUnderlyingTypeName(const uint32_t tyid) {
  MAPBOX_ETERNAL_CONSTEXPR const auto utynamemap =
      mapbox::eternal::map<uint32_t, mapbox::eternal::string>({
        {TYPE_ID_POINT3H, kHalf3},
        {TYPE_ID_POINT3F, kFloat3},
        {TYPE_ID_POINT3D, kDouble3},
        {TYPE_ID_NORMAL3H, kHalf3},
        {TYPE_ID_NORMAL3F, kFloat3},
        {TYPE_ID_NORMAL3D, kDouble3},
        {TYPE_ID_VECTOR3H, kHalf3},
        {TYPE_ID_VECTOR3F, kFloat3},
        {TYPE_ID_VECTOR3D, kDouble3},
        {TYPE_ID_COLOR3H, kHalf3},
        {TYPE_ID_COLOR3F, kFloat3},
        {TYPE_ID_COLOR3D, kDouble3},
        {TYPE_ID_COLOR4H, kHalf4},
        {TYPE_ID_COLOR4F, kFloat4},
        {TYPE_ID_COLOR4D, kDouble4},
        {TYPE_ID_TEXCOORD2H, kHalf2},
        {TYPE_ID_TEXCOORD2F, kFloat2},
        {TYPE_ID_TEXCOORD2D, kDouble2},
        {TYPE_ID_TEXCOORD3H, kHalf3},
        {TYPE_ID_TEXCOORD3F, kFloat3},
        {TYPE_ID_TEXCOORD3D, kDouble3},
        {TYPE_ID_FRAME4D, kMatrix4d},
  });

  {
  bool array_bit = (TYPE_ID_1D_ARRAY_BIT & tyid);
  uint32_t scalar_tid = tyid & (~TYPE_ID_1D_ARRAY_BIT);

  auto ret = utynamemap.find(scalar_tid);
  if (ret != utynamemap.end()) {
    std::string s = ret->second.c_str();
    if (array_bit) {
      s += "[]";
    }
    return std::move(s);
  }
  }

  return TryGetTypeName(tyid);

}